

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

int __thiscall
Ptex::v2_2::PtexReader::DefaultInputHandler::close(DefaultInputHandler *this,int __fd)

{
  int iVar1;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  
  if (CONCAT44(in_register_00000034,__fd) == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = fclose((FILE *)CONCAT44(in_register_00000034,__fd));
    iVar1 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar1 == 0);
  }
  if (this->buffer != (char *)0x0) {
    operator_delete__(this->buffer);
    this->buffer = (char *)0x0;
  }
  return iVar1;
}

Assistant:

virtual bool close(Handle handle) {
            bool ok = handle && (fclose((FILE*)handle) == 0);
            if (buffer) { delete [] buffer; buffer = 0; }
            return ok;
        }